

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadImageLibrary(ColladaParser *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar4;
  undefined4 extraout_var_01;
  string id;
  string local_a8;
  void *local_88;
  undefined8 uStack_80;
  long local_78;
  long *plStack_70;
  undefined8 local_68;
  long alStack_60 [2];
  key_type local_50;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if (((char)iVar1 == '\0') &&
     (iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar1 != '\0')) {
    do {
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar1 == 1) {
        if (iVar2 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"image");
        if (iVar1 == 0) {
          uVar3 = GetAttribute(this,"id");
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,(char *)CONCAT44(extraout_var_00,iVar1),
                     (allocator<char> *)&local_a8);
          local_a8.field_2._8_8_ = 0;
          alStack_60[1] = 0;
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          local_a8._M_string_length = 0;
          local_a8.field_2._M_allocated_capacity = 0;
          local_78 = 0;
          local_88 = (void *)0x0;
          uStack_80 = 0;
          local_68 = 0;
          alStack_60[0] = 0;
          plStack_70 = alStack_60;
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                   ::operator[](&this->mImageLibrary,&local_50);
          std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_a8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    (&pmVar4->mImageData,&local_88);
          std::__cxx11::string::operator=((string *)&pmVar4->mEmbeddedFormat,(string *)&plStack_70);
          if (plStack_70 != alStack_60) {
            operator_delete(plStack_70,alStack_60[0] + 1);
          }
          if (local_88 != (void *)0x0) {
            operator_delete(local_88,local_78 - (long)local_88);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                   ::operator[](&this->mImageLibrary,&local_50);
          ReadImage(this,pmVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          SkipElement(this);
        }
      }
      else if (iVar2 == 2) {
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var_01,iVar1),"library_images");
        if (iVar1 == 0) {
          return;
        }
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Expected end of <library_images> element.","");
        ThrowException(this,&local_a8);
      }
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar1 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadImageLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("image"))
            {
                // read ID. Another entry which is "optional" by design but obligatory in reality
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                mImageLibrary[id] = Image();

                // read on from there
                ReadImage(mImageLibrary[id]);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "library_images") != 0)
                ThrowException("Expected end of <library_images> element.");

            break;
        }
    }
}